

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O2

err_t BufRead(bufstream *p,uint8_t *Data,size_t Size,size_t *Readed)

{
  stream *psVar1;
  uint __line;
  size_t *psVar2;
  err_t eVar3;
  err_t eVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __n;
  ulong local_40;
  size_t *local_38;
  
  local_38 = &p->ReadSize;
  eVar3 = 0;
  for (uVar6 = 0; psVar2 = local_38, uVar7 = Size - uVar6, uVar5 = Size, uVar7 != 0;
      uVar6 = uVar6 + __n) {
    uVar5 = p->ReadPos;
    uVar8 = p->ReadSize;
    if (uVar8 <= uVar5) {
      if (0x1000 < uVar7) {
        psVar1 = p->Stream;
        local_40 = uVar7;
        if (psVar1 != (stream *)0x0) {
          eVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x58))
                            (psVar1,Data + uVar6,uVar7,&local_40);
          if (Readed == (size_t *)0x0) {
            return eVar3;
          }
          *Readed = uVar6 + local_40;
          return eVar3;
        }
        __line = 0x41;
LAB_0011308b:
        __assert_fail("(const void*)(p->Stream)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                      ,__line,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
      }
      p->ReadPos = 0;
      psVar1 = p->Stream;
      if (psVar1 == (stream *)0x0) {
        __line = 0x48;
        goto LAB_0011308b;
      }
      eVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x58))(psVar1,p->Buffer,0x1000,local_38);
      uVar8 = *psVar2;
      uVar5 = uVar6;
      if (uVar8 == 0) break;
      uVar5 = p->ReadPos;
    }
    __n = uVar8 - uVar5;
    if (uVar7 < uVar8 - uVar5) {
      __n = uVar7;
    }
    memcpy(Data + uVar6,p->Buffer + uVar5,__n);
    p->ReadPos = p->ReadPos + __n;
  }
  if (Readed != (size_t *)0x0) {
    *Readed = uVar5;
  }
  eVar4 = 0;
  if (uVar5 < Size) {
    eVar4 = eVar3;
  }
  return eVar4;
}

Assistant:

static err_t BufRead(bufstream* p,uint8_t* Data,size_t Size,size_t* Readed)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->ReadSize <= p->ReadPos)
        {
            if (Left > BUFSTREAM_SIZE)
            {
                Err = Stream_Read(p->Stream,Data+Pos,Left,&Left);
                if (Readed)
                    *Readed = Pos+Left;
                return Err;
            }

            p->ReadPos = 0;
            Err = Stream_Read(p->Stream,p->Buffer,BUFSTREAM_SIZE,&p->ReadSize);
            if (p->ReadSize <= 0)
                break;
        }

        if (Left > p->ReadSize - p->ReadPos)
            Left = p->ReadSize - p->ReadPos;

        memcpy(Data+Pos,p->Buffer+p->ReadPos,Left);
        Pos += Left;
        p->ReadPos += Left;
    }

    if (Readed)
        *Readed = Pos;

    if (Pos >= Size)
        Err = ERR_NONE; //override possible end of file in later of the buffer
    return Err;
}